

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

double __thiscall
ON_SubDVertex::GetSharpSubdivisionPoint(ON_SubDVertex *this,ON_3dPoint *sharp_subdivision_point)

{
  ON_3dPoint local_1c8;
  ON_3dPoint local_1b0;
  ON_3dPoint local_198;
  ON_3dPoint local_180;
  ON_3dPoint local_168;
  ON_3dPoint local_150;
  ON_3dPoint local_138;
  ON_3dPoint local_120;
  ON_3dPoint local_108;
  ON_3dPoint local_f0;
  ON_3dPoint local_d8;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  double local_60;
  double vs;
  double c [3];
  ON_SubDVertex *local_38;
  ON_SubDVertex *v [3];
  uint count;
  ON_3dPoint *sharp_subdivision_point_local;
  ON_SubDVertex *this_local;
  
  v[2]._4_4_ = 0;
  memset(&local_38,0,0x18);
  memset(&vs,0,0x18);
  local_60 = GetSharpSubdivisionPoint(this,(uint *)((long)v + 0x14),&local_38,&vs);
  if (((local_60 <= 0.0) || (v[2]._4_4_ == 0)) || (local_38 == (ON_SubDVertex *)0x0)) {
    local_60 = 0.0;
    sharp_subdivision_point->x = ON_3dPoint::NanPoint.x;
    sharp_subdivision_point->y = ON_3dPoint::NanPoint.y;
    sharp_subdivision_point->z = ON_3dPoint::NanPoint.z;
  }
  else if (v[2]._4_4_ == 1) {
    ControlNetPoint(&local_90,local_38);
    ::operator*(&local_78,vs,&local_90);
    sharp_subdivision_point->x = local_78.x;
    sharp_subdivision_point->y = local_78.y;
    sharp_subdivision_point->z = local_78.z;
  }
  else if (v[2]._4_4_ == 2) {
    ControlNetPoint(&local_d8,local_38);
    ::operator*(&local_c0,vs,&local_d8);
    ControlNetPoint(&local_108,v[0]);
    ::operator*(&local_f0,c[0],&local_108);
    ON_3dPoint::operator+(&local_a8,&local_c0,&local_f0);
    sharp_subdivision_point->x = local_a8.x;
    sharp_subdivision_point->y = local_a8.y;
    sharp_subdivision_point->z = local_a8.z;
  }
  else if (v[2]._4_4_ == 3) {
    ControlNetPoint(&local_168,local_38);
    ::operator*(&local_150,vs,&local_168);
    ControlNetPoint(&local_198,v[0]);
    ::operator*(&local_180,c[0],&local_198);
    ON_3dPoint::operator+(&local_138,&local_150,&local_180);
    ControlNetPoint(&local_1c8,v[1]);
    ::operator*(&local_1b0,c[1],&local_1c8);
    ON_3dPoint::operator+(&local_120,&local_138,&local_1b0);
    sharp_subdivision_point->x = local_120.x;
    sharp_subdivision_point->y = local_120.y;
    sharp_subdivision_point->z = local_120.z;
  }
  else {
    local_60 = 0.0;
    sharp_subdivision_point->x = ON_3dPoint::NanPoint.x;
    sharp_subdivision_point->y = ON_3dPoint::NanPoint.y;
    sharp_subdivision_point->z = ON_3dPoint::NanPoint.z;
  }
  return local_60;
}

Assistant:

double ON_SubDVertex::GetSharpSubdivisionPoint(ON_3dPoint& sharp_subdivision_point) const
{
  unsigned count = 0;
  const ON_SubDVertex* v[3] = {};
  double c[3] = {};
  double vs = this->GetSharpSubdivisionPoint(count,v,c);
  if (vs > 0.0 && count > 0U && nullptr != v[0])
  {
    switch (count)
    {
    case 1:
      sharp_subdivision_point = c[0] * v[0]->ControlNetPoint();
      break;
    case 2:
      sharp_subdivision_point 
        = c[0] * v[0]->ControlNetPoint() 
        + c[1] * v[1]->ControlNetPoint();
      break;
    case 3:
      sharp_subdivision_point 
        = c[0] * v[0]->ControlNetPoint() 
        + c[1] * v[1]->ControlNetPoint() 
        + c[2] * v[2]->ControlNetPoint();
      break;
    default:
      vs = 0.0;
      sharp_subdivision_point = ON_3dPoint::NanPoint;
      break;
    }
  }
  else
  {
    vs = 0.0;
    sharp_subdivision_point = ON_3dPoint::NanPoint;
  }
  return vs;
}